

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O2

void TTD::NSLogEvents::CreateError_Execute<(TTD::NSLogEvents::EventKind)27>
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  JsRTVarsArgumentAction_InternalUse<1UL> *errorData;
  ScriptContext *ctx;
  Var local_30;
  Var res;
  
  errorData = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)27>
                        (evt);
  local_30 = (Var)0x0;
  ctx = ThreadContextTTD::GetActiveScriptContext(executeContext);
  Execute_CreateErrorHelper(errorData,executeContext,ctx,CreateTypeErrorActionTag,&local_30);
  if (local_30 != (Var)0x0) {
    JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)27>
              (executeContext,evt,local_30);
  }
  return;
}

Assistant:

void CreateError_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, errorKind>(evt);

            Js::Var res = nullptr;
            Execute_CreateErrorHelper(action, executeContext, executeContext->GetActiveScriptContext(), errorKind, &res);

            if(res != nullptr)
            {
                JsRTActionHandleResultForReplay<JsRTSingleVarArgumentAction, errorKind>(executeContext, evt, res);
            }
        }